

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_long,unsigned_long(*&)(unsigned_long,unsigned_long)>
          (Memory *this,u64 offset,u64 addend,unsigned_long rhs,
          BinopFunc<unsigned_long,_unsigned_long> **func,unsigned_long *out)

{
  Result RVar1;
  unsigned_long val;
  Enum EVar2;
  unsigned_long lhs;
  unsigned_long *local_38;
  
  local_38 = out;
  RVar1 = AtomicLoad<unsigned_long>(this,offset,addend,&lhs);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    val = (**func)(lhs,rhs);
    RVar1 = AtomicStore<unsigned_long>(this,offset,addend,val);
    if (RVar1.enum_ != Error) {
      *local_38 = lhs;
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}